

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_True_Test::iu_SyntaxTest_x_iutest_x_True_Test
          (iu_SyntaxTest_x_iutest_x_True_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00394580;
  return;
}

Assistant:

IUTEST(SyntaxTest, True)
{
    if( bool b = true )
        IUTEST_ASSERT_TRUE(b) << b;
    if( bool b = true )
        IUTEST_EXPECT_TRUE(b) << b;
    if( bool b = true )
        IUTEST_INFORM_TRUE(b) << b;
    if( bool b = true )
        IUTEST_ASSUME_TRUE(b) << b;
}